

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O3

Greetable * greetable_proxy_new_finish(GAsyncResult *res,GError **error)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  GType GVar4;
  Greetable *pGVar5;
  
  uVar1 = g_async_result_get_source_object();
  uVar2 = g_async_initable_get_type();
  uVar2 = g_type_check_instance_cast(uVar1,uVar2);
  lVar3 = g_async_initable_new_finish(uVar2,res,error);
  g_object_unref(uVar1);
  if (lVar3 != 0) {
    GVar4 = greetable_get_type();
    pGVar5 = (Greetable *)g_type_check_instance_cast(lVar3,GVar4);
    return pGVar5;
  }
  return (Greetable *)0x0;
}

Assistant:

Greetable *
greetable_proxy_new_finish (
    GAsyncResult        *res,
    GError             **error)
{
  GObject *ret;
  GObject *source_object;
  source_object = g_async_result_get_source_object (res);
  ret = g_async_initable_new_finish (G_ASYNC_INITABLE (source_object), res, error);
  g_object_unref (source_object);
  if (ret != NULL)
    return GREETABLE (ret);
  else
    return NULL;
}